

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_ratio_node0(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio_node0)

{
  REF_DBL *pRVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  REF_DBL RVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  REF_DBL m [6];
  double local_78 [6];
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  if ((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->max <= node1)) ||
     (((node1 < 0 || (ref_node->global[(uint)node0] < 0)) || (ref_node->global[(uint)node1] < 0))))
  {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x655,
           "ref_node_ratio_node0",3,"node invalid");
    return 3;
  }
  pRVar1 = ref_node->real;
  uVar3 = (ulong)(uint)(node1 * 0xf);
  uVar2 = node0 * 0xf;
  dVar10 = pRVar1[uVar3] - pRVar1[uVar2];
  dVar9 = pRVar1[uVar3 + 1] - pRVar1[(ulong)uVar2 + 1];
  dVar8 = pRVar1[uVar3 + 2] - pRVar1[(ulong)uVar2 + 2];
  dVar5 = dVar8 * dVar8 + dVar10 * dVar10 + dVar9 * dVar9;
  if (dVar5 < 0.0) {
    uStack_20 = 0;
    uStack_30 = 0;
    uStack_40 = 0;
    local_48 = dVar10;
    local_38 = dVar9;
    local_28 = dVar8;
    dVar5 = sqrt(dVar5);
    dVar8 = local_28;
    dVar9 = local_38;
    dVar10 = local_48;
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar5 = dVar5 * 1e+20;
  if (dVar5 <= -dVar5) {
    dVar5 = -dVar5;
  }
  dVar7 = dVar10;
  if (dVar10 <= -dVar10) {
    dVar7 = -dVar10;
  }
  if (dVar7 < dVar5) {
    dVar7 = dVar9;
    if (dVar9 <= -dVar9) {
      dVar7 = -dVar9;
    }
    if (dVar7 < dVar5) {
      dVar7 = dVar8;
      if (dVar8 <= -dVar8) {
        dVar7 = -dVar8;
      }
      if (dVar7 < dVar5) {
        pRVar1 = ref_node->real;
        lVar4 = 0;
        do {
          local_78[lVar4] = pRVar1[(int)(uVar2 + 3 + (int)lVar4)];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 6);
        dVar5 = (local_78[5] * dVar8 + local_78[2] * dVar10 + dVar9 * local_78[4]) * dVar8 +
                (local_78[2] * dVar8 + local_78[0] * dVar10 + dVar9 * local_78[1]) * dVar10 +
                (local_78[4] * dVar8 + local_78[1] * dVar10 + local_78[3] * dVar9) * dVar9;
        if (dVar5 < 0.0) {
          RVar6 = sqrt(dVar5);
        }
        else {
          RVar6 = SQRT(dVar5);
        }
        *ratio_node0 = RVar6;
        return 0;
      }
    }
  }
  *ratio_node0 = 0.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_ratio_node0(REF_NODE ref_node, REF_INT node0,
                                        REF_INT node1, REF_DBL *ratio_node0) {
  REF_DBL direction[3], length;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio_node0 = 0.0;
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  *ratio_node0 = ref_matrix_sqrt_vt_m_v(m, direction);

  return REF_SUCCESS;
}